

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O0

int zddSiftUp(DdManager *table,int x,int xLow)

{
  int iVar1;
  int local_24;
  int size;
  int y;
  int xLow_local;
  int x_local;
  DdManager *table_local;
  
  local_24 = cuddZddNextLow(table,x);
  y = x;
  while( true ) {
    if (local_24 < xLow) {
      return 1;
    }
    iVar1 = cuddZddSwapInPlace(table,local_24,y);
    if (iVar1 == 0) break;
    y = local_24;
    local_24 = cuddZddNextLow(table,local_24);
  }
  return 0;
}

Assistant:

static int
zddSiftUp(
  DdManager * table,
  int  x,
  int  xLow)
{
    int        y;
    int        size;

    y = cuddZddNextLow(table,x);
    while (y >= xLow) {
        size = cuddZddSwapInPlace(table,y,x);
        if (size == 0) {
            return(0);
        }
        x = y;
        y = cuddZddNextLow(table,x);
    }
    return(1);

}